

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O3

void __thiscall WavingSketch<8U,_1U,_4U>::shrink(WavingSketch<8U,_1U,_4U> *this)

{
  uchar *puVar1;
  uint uVar2;
  Bucket *pBVar3;
  Bucket *pBVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar2 = this->BUCKET_NUM;
  if ((uVar2 & 1) == 0) {
    uVar9 = uVar2 >> 1;
    uVar10 = (ulong)uVar9 * 0x44;
    pBVar4 = (Bucket *)operator_new__(uVar10);
    if (uVar2 != 0) {
      uVar5 = 0;
      do {
        puVar1 = pBVar4->items[0].str + uVar5;
        *(undefined8 *)puVar1 = 0;
        *(undefined8 *)(puVar1 + 8) = 0;
        *(undefined8 *)(puVar1 + 0x10) = 0;
        *(undefined8 *)(puVar1 + 0x18) = 0;
        uVar5 = uVar5 + 0x44;
      } while (uVar10 != uVar5);
      if (uVar2 != 0) {
        piVar8 = pBVar4->counters;
        lVar7 = 0x20;
        uVar10 = 0;
        do {
          uVar5 = uVar10 + uVar9;
          pBVar3 = this->buckets;
          if (uVar5 < this->BUCKET_NUM) {
            mergebuck(this,pBVar3 + uVar10,pBVar3 + uVar5,pBVar4 + uVar10);
          }
          else {
            pBVar4[uVar10].incast[0] = pBVar3[uVar10].incast[0];
            lVar6 = -8;
            do {
              piVar8[lVar6] = *(int *)(pBVar3->items[lVar6].str + lVar7);
              piVar8[lVar6 + 8] = *(int *)((long)pBVar3->counters + lVar6 * 4 + lVar7);
              lVar6 = lVar6 + 1;
            } while (lVar6 != 0);
          }
          uVar10 = uVar10 + 1;
          piVar8 = piVar8 + 0x11;
          lVar7 = lVar7 + 0x44;
        } while (uVar10 != uVar9 + (uVar9 == 0));
      }
    }
    this->BUCKET_NUM = uVar9;
    if (this->buckets != (Bucket *)0x0) {
      operator_delete__(this->buckets);
    }
    this->buckets = pBVar4;
    return;
  }
  printf("Bucket num %d is odd, can NOT shrink!\n",(ulong)uVar2);
  puts("FATAL ERROR!");
  exit(-1);
}

Assistant:

void shrink() {
		// shrink to half of total buckets
		if (BUCKET_NUM % 2) {
			printf("Bucket num %d is odd, can NOT shrink!\n", BUCKET_NUM);
			printf("FATAL ERROR!\n");
			exit(-1);
		}
		uint32_t num = (BUCKET_NUM + 1) >> 1;
		Bucket* tpbuck = new Bucket[num];
		for (uint32_t i = 0; i < num; i++) {
			if (i + num < BUCKET_NUM)
				mergebuck(&buckets[i], &buckets[i + num], &tpbuck[i]);
			else
				copybuck(&buckets[i], &tpbuck[i]);
		}
		BUCKET_NUM = num;
		delete[] buckets;
		buckets = tpbuck;
	}